

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeNew(ExpressionContext *ctx,SynNew *syntax)

{
  TypeBase *pTVar1;
  Allocator *pAVar2;
  FunctionData *pFVar3;
  ArrayView<ArgumentData> arguments_00;
  bool bVar4;
  int iVar5;
  TypeBase *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynBase *pSVar8;
  ExprBase *pEVar9;
  VariableData *pVVar10;
  ExprBase *pEVar11;
  ExprBase *first;
  _func_int **pp_Var12;
  undefined4 extraout_var_03;
  SynBase *pSVar13;
  SynBase *pSVar14;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  ExprBase **ppEVar15;
  SynIdentifier *name;
  undefined4 extraout_var_13;
  uint uVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  uint count;
  long lVar20;
  SynCallArgument *pSVar21;
  SynArrayIndex *arrayIndex;
  InplaceStr IVar22;
  ArrayView<FunctionData_*> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  ArrayView<ExprBase_*> arr_01;
  ExprBase *function;
  TypedFunctionInstanceRequest request;
  SmallArray<FunctionData_*,_32U> functions;
  SmallArray<ArgumentData,_32U> arguments;
  SmallArray<FunctionValue,_32U> functions_1;
  ExprSequence *local_b38;
  ExprBase *local_b28;
  TypeBase *local_b20;
  char *local_b18;
  SmallArray<ExprBase_*,_3U> local_b10;
  ArgumentData *local_ae0;
  undefined4 uStack_ad8;
  uint uStack_ad4;
  TypedFunctionInstanceRequest local_ad0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  SmallArray<FunctionData_*,_32U> local_a78;
  undefined1 local_960 [24];
  ExprBase *local_948 [2];
  TypeBase *local_938;
  Allocator *local_350;
  SmallArray<FunctionValue,_32U> local_348;
  SynCallArgument *pSVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  undefined4 extraout_var_12;
  
  pTVar6 = AnalyzeType(ctx,syntax->type,false,(bool *)0x0);
  if (pTVar6 == (TypeBase *)0x0) {
    pSVar8 = syntax->type;
    if (syntax->count == (SynBase *)0x0) {
      if (pSVar8 != (SynBase *)0x0) {
        if ((pSVar8->typeID == 0x19) && (lVar17 = *(long *)&pSVar8[1].typeID, lVar17 != 0)) {
          iVar5 = 1;
          lVar20 = lVar17;
          do {
            lVar20 = *(long *)(lVar20 + 0x30);
            iVar5 = iVar5 + -1;
          } while (lVar20 != 0);
          if ((iVar5 == 0) && (*(long *)(lVar17 + 0x40) == 0)) {
            syntax->count = *(SynBase **)(lVar17 + 0x48);
            pSVar8 = (SynBase *)pSVar8[1]._vptr_SynBase;
            syntax->type = pSVar8;
            pTVar6 = AnalyzeType(ctx,pSVar8,false,(bool *)0x0);
            if (pTVar6 != (TypeBase *)0x0) goto LAB_001f1642;
            pSVar8 = syntax->type;
          }
        }
        goto LAB_001f14d7;
      }
LAB_001f1625:
      pSVar8 = (SynBase *)0x0;
    }
    else {
LAB_001f14d7:
      if ((syntax->arguments).head == (SynCallArgument *)0x0) {
        if (pSVar8 == (SynBase *)0x0) goto LAB_001f1625;
        if (pSVar8->typeID == 0xb) {
          pSVar14 = *(SynBase **)&pSVar8[1].typeID;
          if (pSVar14 != (SynBase *)0x0) {
            do {
              iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
              pSVar7 = (SynCallArgument *)CONCAT44(extraout_var,iVar5);
              SynBase::SynBase((SynBase *)pSVar7,0x18,pSVar14->begin,pSVar14->end);
              (pSVar7->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6a20;
              pSVar7->name = (SynIdentifier *)0x0;
              pSVar7->value = pSVar14;
              IntrusiveList<SynCallArgument>::push_back(&syntax->arguments,pSVar7);
              pSVar14 = pSVar14->next;
            } while (pSVar14 != (SynBase *)0x0);
          }
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          pSVar14 = (SynBase *)CONCAT44(extraout_var_00,iVar5);
          pp_Var12 = pSVar8[1]._vptr_SynBase;
          SynBase::SynBase(pSVar14,10,pSVar8->begin,pSVar8->end);
          pSVar14->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6b00;
          pSVar14[1]._vptr_SynBase = pp_Var12;
          syntax->type = pSVar14;
          pTVar6 = AnalyzeType(ctx,pSVar14,false,(bool *)0x0);
          if (pTVar6 != (TypeBase *)0x0) goto LAB_001f1642;
          pSVar8 = syntax->type;
        }
      }
    }
    AnalyzeType(ctx,pSVar8,true,(bool *)0x0);
    pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  }
LAB_001f1642:
  if (pTVar6->isGeneric == true) {
    anon_unknown.dwarf_1117a3::Stop(ctx,syntax->type,"ERROR: generic type is not allowed");
  }
  if ((pTVar6 == ctx->typeVoid) || (pTVar6 == ctx->typeAuto)) {
    pSVar8 = syntax->type;
    uVar16 = *(int *)&(pTVar6->name).end - (int)(pTVar6->name).begin;
    pcVar18 = "ERROR: can\'t allocate objects of type \'%.*s\'";
LAB_001f21c4:
    anon_unknown.dwarf_1117a3::Stop(ctx,pSVar8,pcVar18,(ulong)uVar16);
  }
  if ((pTVar6->typeID == 0x18) && (*(char *)&pTVar6[3]._vptr_TypeBase == '\0')) {
    pSVar8 = syntax->type;
    uVar16 = *(int *)&(pTVar6->name).end - (int)(pTVar6->name).begin;
    pcVar18 = "ERROR: type \'%.*s\' is not fully defined";
    goto LAB_001f21c4;
  }
  pSVar8 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  if (syntax->count != (SynBase *)0x0) {
    pSVar7 = (syntax->arguments).head;
    if (pSVar7 != (SynCallArgument *)0x0) {
      anon_unknown.dwarf_1117a3::Report
                (ctx,&pSVar7->super_SynBase,
                 "ERROR: can\'t provide constructor arguments to array allocation");
    }
    pSVar14 = (syntax->constructor).head;
    if (pSVar14 != (SynBase *)0x0) {
      anon_unknown.dwarf_1117a3::Report
                (ctx,pSVar14,"ERROR: can\'t provide custom construction code for array allocation");
    }
    pEVar9 = AnalyzeExpression(ctx,syntax->count);
    pEVar9 = CreateArrayAllocation(ctx,&syntax->super_SynBase,pTVar6,pEVar9);
    bVar4 = HasDefaultConstructor(ctx,&syntax->super_SynBase,pTVar6);
    if (!bVar4) {
      return pEVar9;
    }
    pVVar10 = anon_unknown.dwarf_1117a3::AllocateTemporary(ctx,&syntax->super_SynBase,pEVar9->type);
    pEVar11 = CreateVariableAccess(ctx,pSVar8,pVVar10,false);
    pEVar11 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar11,pEVar9);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    first = (ExprBase *)CONCAT44(extraout_var_01,iVar5);
    pTVar6 = ctx->typeVoid;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var12 = (_func_int **)CONCAT44(extraout_var_02,iVar5);
    *pp_Var12 = (_func_int *)0x0;
    pp_Var12[1] = (_func_int *)pVVar10;
    pp_Var12[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var12 + 3) = 0;
    first->typeID = 0x1e;
    first->source = pSVar8;
    first->type = pTVar6;
    first->next = (ExprBase *)0x0;
    first->listed = false;
    first->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e64e0;
    first[1]._vptr_ExprBase = pp_Var12;
    *(ExprBase **)&first[1].typeID = pEVar11;
    pTVar6 = pVVar10->type;
    pEVar11 = CreateVariableAccess(ctx,pSVar8,pVVar10,true);
    pEVar11 = CreateDefaultConstructorCall(ctx,&syntax->super_SynBase,pTVar6,pEVar11);
    if (pEVar11 == (ExprBase *)0x0) {
      return pEVar9;
    }
    pEVar9 = CreateVariableAccess(ctx,pSVar8,pVVar10,true);
    pEVar9 = CreateSequence(ctx,&syntax->super_SynBase,first,pEVar11,pEVar9);
    return pEVar9;
  }
  local_b38 = (ExprSequence *)CreateObjectAllocation(ctx,&syntax->super_SynBase,pTVar6);
  pTVar6 = (local_b38->super_ExprBase).type;
  if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0x12)) {
    pTVar6 = (TypeBase *)0x0;
  }
  pTVar1 = (TypeBase *)pTVar6[1]._vptr_TypeBase;
  local_a78.allocator = ctx->allocator;
  local_a78.data = local_a78.little;
  local_a78.count = 0;
  local_a78.max = 0x20;
  bVar4 = GetTypeConstructorFunctions
                    (ctx,pTVar1,(syntax->arguments).head == (SynCallArgument *)0x0,&local_a78);
  local_b20 = pTVar1;
  if (bVar4) {
    pVVar10 = anon_unknown.dwarf_1117a3::AllocateTemporary
                        (ctx,&syntax->super_SynBase,(local_b38->super_ExprBase).type);
    pEVar9 = CreateVariableAccess(ctx,pSVar8,pVVar10,false);
    pEVar9 = CreateAssignment(ctx,pSVar8,pEVar9,(ExprBase *)local_b38);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pSVar14 = (SynBase *)CONCAT44(extraout_var_03,iVar5);
    pTVar1 = ctx->typeVoid;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pSVar13 = (SynBase *)CONCAT44(extraout_var_04,iVar5);
    pSVar13->_vptr_SynBase = (_func_int **)0x0;
    *(VariableData **)&pSVar13->typeID = pVVar10;
    pSVar13->begin = (Lexeme *)0x0;
    *(undefined1 *)&pSVar13->end = 0;
    pSVar14->typeID = 0x1e;
    pSVar14->begin = (Lexeme *)pSVar8;
    pSVar14->end = (Lexeme *)pTVar1;
    (pSVar14->pos).begin = (char *)0x0;
    *(bool *)&(pSVar14->pos).end = false;
    pSVar14->_vptr_SynBase = (_func_int **)&PTR__ExprBase_003e64e0;
    pSVar14->next = pSVar13;
    *(ExprBase **)&pSVar14->listed = pEVar9;
    functions_00.count = local_a78.count;
    functions_00.data = local_a78.data;
    pEVar9 = CreateVariableAccess(ctx,pSVar8,pVVar10,false);
    functions_00._12_4_ = 0;
    pEVar9 = CreateConstructorAccess(ctx,&syntax->super_SynBase,functions_00,pEVar9);
    pSVar7 = (syntax->arguments).head;
    pEVar9 = CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar9,
                                (IntrusiveList<TypeHandle>)ZEXT816(0),pSVar7,
                                pSVar7 == (SynCallArgument *)0x0);
    if (pEVar9 != (ExprBase *)0x0) {
      local_938 = (TypeBase *)ctx->allocator;
      local_960._0_8_ = local_960 + 0x10;
      local_960._8_4_ = 2;
      local_960._12_4_ = 3;
      local_960._16_8_ = pSVar14;
      local_948[0] = pEVar9;
      pSVar14 = (SynBase *)CreateVariableAccess(ctx,pSVar8,pVVar10,false);
      if (local_960._8_4_ == local_960._12_4_) {
        SmallArray<ExprBase_*,_3U>::grow((SmallArray<ExprBase_*,_3U> *)local_960,local_960._8_4_);
      }
      if ((ArgumentData *)local_960._0_8_ == (ArgumentData *)0x0) goto LAB_001f21ce;
      uVar19 = (ulong)(uint)local_960._8_4_;
      local_960._8_4_ = local_960._8_4_ + 1;
      ((SynBase **)local_960._0_8_)[uVar19] = pSVar14;
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      local_b38 = (ExprSequence *)CONCAT44(extraout_var_05,iVar5);
      arr.count = local_960._8_4_;
      arr.data = (ExprBase **)local_960._0_8_;
      arr._12_4_ = 0;
      ExprSequence::ExprSequence(local_b38,ctx->allocator,&syntax->super_SynBase,pTVar6,arr);
LAB_001f1cbb:
      SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)local_960);
    }
LAB_001f1cc8:
    if ((syntax->constructor).head == (SynBase *)0x0) {
LAB_001f2159:
      SmallArray<FunctionData_*,_32U>::~SmallArray(&local_a78);
      return &local_b38->super_ExprBase;
    }
    pVVar10 = anon_unknown.dwarf_1117a3::AllocateTemporary
                        (ctx,&syntax->super_SynBase,(local_b38->super_ExprBase).type);
    pEVar9 = CreateVariableAccess(ctx,pSVar8,pVVar10,false);
    pEVar9 = CreateAssignment(ctx,pSVar8,pEVar9,&local_b38->super_ExprBase);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar11 = (ExprBase *)CONCAT44(extraout_var_10,iVar5);
    pTVar1 = ctx->typeVoid;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var12 = (_func_int **)CONCAT44(extraout_var_11,iVar5);
    iVar5 = 0;
    *pp_Var12 = (_func_int *)0x0;
    pp_Var12[1] = (_func_int *)pVVar10;
    pp_Var12[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var12 + 3) = 0;
    pEVar11->typeID = 0x1e;
    pEVar11->source = pSVar8;
    pEVar11->type = pTVar1;
    pEVar11->next = (ExprBase *)0x0;
    pEVar11->listed = false;
    pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e64e0;
    pEVar11[1]._vptr_ExprBase = pp_Var12;
    *(ExprBase **)&pEVar11[1].typeID = pEVar9;
    local_ad0.instanceType = local_b20;
    if (local_b20 != (TypeBase *)0x0) {
      iVar5 = local_b20->nameHash * 0x21;
    }
    local_ad0.hash = (int)((ulong)syntax >> 0x10) + (int)syntax + iVar5;
    local_b28 = (ExprBase *)0x0;
    local_ad0.syntax = &syntax->super_SynBase;
    ppEVar15 = SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
               ::find(&ctx->newConstructorFunctions,&local_ad0);
    if (ppEVar15 != (ExprBase **)0x0) {
      local_b28 = *ppEVar15;
    }
    if (local_b28 == (ExprBase *)0x0) {
      IVar22 = GetTemporaryFunctionName(ctx);
      local_b18 = IVar22.begin;
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      name = (SynIdentifier *)CONCAT44(extraout_var_12,iVar5);
      (name->super_SynBase).typeID = 4;
      (name->super_SynBase).begin = (Lexeme *)0x0;
      (name->super_SynBase).end = (Lexeme *)0x0;
      (name->super_SynBase).pos.begin = (char *)0x0;
      (name->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
      (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
      (name->name).begin = local_b18;
      (name->name).end = IVar22.end;
      local_a88 = 0;
      uStack_a80 = 0;
      local_a98 = 0;
      uStack_a90 = 0;
      local_aa8 = 0;
      uStack_aa0 = 0;
      local_b28 = CreateFunctionDefinition
                            (ctx,&syntax->super_SynBase,false,false,local_b20,false,ctx->typeVoid,
                             false,name,(IntrusiveList<SynIdentifier>)ZEXT816(0),
                             (IntrusiveList<SynFunctionArgument>)ZEXT816(0),syntax->constructor,
                             (FunctionData *)0x0,(TypeFunction *)0x0,
                             (IntrusiveList<MatchData>)ZEXT816(0));
      SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
      ::insert(&ctx->newConstructorFunctions,&local_ad0,&local_b28);
    }
    pEVar9 = local_b28;
    pAVar2 = ctx->allocator;
    memset(local_348.little,0,0x300);
    local_348.count = 0;
    local_348.max = 0x20;
    pFVar3 = (FunctionData *)pEVar9[1]._vptr_ExprBase;
    local_348.data = local_348.little;
    local_348.allocator = pAVar2;
    pEVar9 = CreateVariableAccess(ctx,pSVar8,pVVar10,false);
    if (pEVar9 == (ExprBase *)0x0) {
      __assert_fail("context",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                    ,0x289,"FunctionValue::FunctionValue(SynBase *, FunctionData *, ExprBase *)");
    }
    if (local_348.count == local_348.max) {
      SmallArray<FunctionValue,_32U>::grow(&local_348,local_348.count);
    }
    if (local_348.data == (FunctionValue *)0x0) {
      pcVar18 = 
      "void SmallArray<FunctionValue, 32>::push_back(const T &) [T = FunctionValue, N = 32]";
      goto LAB_001f2252;
    }
    uVar19 = local_348._8_8_ & 0xffffffff;
    functions_01.count = local_348.count + 1;
    local_348.count = functions_01.count;
    local_348.data[uVar19].source = &syntax->super_SynBase;
    local_348.data[uVar19].function = pFVar3;
    local_348.data[uVar19].context = pEVar9;
    pAVar2 = ctx->allocator;
    lVar17 = 0x20;
    do {
      *(undefined8 *)(local_960 + lVar17 + -0x10) = 0;
      local_960[lVar17 + -8] = 0;
      *(undefined8 *)(local_960 + lVar17) = 0;
      *(undefined8 *)(local_960 + lVar17 + 8) = 0;
      *(undefined8 *)((long)local_948 + lVar17 + -8) = 0;
      *(undefined8 *)((long)local_948 + lVar17) = 0;
      lVar17 = lVar17 + 0x30;
    } while (lVar17 != 0x620);
    local_ae0 = (ArgumentData *)(local_960 + 0x10);
    local_960._8_4_ = 0;
    local_960._12_4_ = 0x20;
    local_ab8 = 0;
    uStack_ab0 = 0;
    uStack_ad8 = 0;
    arguments_00._8_8_ = (ulong)uStack_ad4 << 0x20;
    arguments_00.data = local_ae0;
    functions_01.data = local_348.data;
    functions_01._12_4_ = 0;
    local_960._0_8_ = local_ae0;
    local_350 = pAVar2;
    local_b10.little[1] =
         CreateFunctionCallFinal
                   (ctx,&syntax->super_SynBase,local_b28,functions_01,
                    (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_00,false);
    local_b10.allocator = ctx->allocator;
    local_b10.data = local_b10.little;
    local_b10.count = 2;
    local_b10.max = 3;
    local_b10.little[0] = pEVar11;
    pEVar9 = CreateVariableAccess(ctx,pSVar8,pVVar10,false);
    if (local_b10.count == local_b10.max) {
      SmallArray<ExprBase_*,_3U>::grow(&local_b10,local_b10.count);
    }
    if (local_b10.data != (ExprBase **)0x0) {
      uVar19 = (ulong)local_b10.count;
      local_b10.count = local_b10.count + 1;
      local_b10.data[uVar19] = pEVar9;
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      local_b38 = (ExprSequence *)CONCAT44(extraout_var_13,iVar5);
      arr_01.count = local_b10.count;
      arr_01.data = local_b10.data;
      arr_01._12_4_ = 0;
      ExprSequence::ExprSequence(local_b38,ctx->allocator,&syntax->super_SynBase,pTVar6,arr_01);
      SmallArray<ExprBase_*,_3U>::~SmallArray(&local_b10);
      SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)local_960);
      SmallArray<FunctionValue,_32U>::~SmallArray(&local_348);
      goto LAB_001f2159;
    }
  }
  else {
    pSVar7 = (syntax->arguments).head;
    if (pSVar7 == (SynCallArgument *)0x0) goto LAB_001f1cc8;
    iVar5 = 1;
    pSVar21 = pSVar7;
    do {
      pSVar21 = (SynCallArgument *)(pSVar21->super_SynBase).next;
      iVar5 = iVar5 + -1;
    } while (pSVar21 != (SynCallArgument *)0x0);
    if ((iVar5 != 0) || (pSVar7->name != (SynIdentifier *)0x0)) {
      pcVar18 = (pTVar1->name).begin;
      uVar19 = (long)(pTVar1->name).end - (long)pcVar18;
      iVar5 = 0;
      do {
        iVar5 = iVar5 + 1;
        pSVar7 = (SynCallArgument *)(pSVar7->super_SynBase).next;
      } while (pSVar7 != (SynCallArgument *)0x0);
      anon_unknown.dwarf_1117a3::Stop
                (ctx,&syntax->super_SynBase,
                 "ERROR: function \'%.*s::%.*s\' that accepts %d arguments is undefined",uVar19,
                 pcVar18,uVar19 & 0xffffffff,(int)pcVar18,iVar5);
    }
    pVVar10 = anon_unknown.dwarf_1117a3::AllocateTemporary
                        (ctx,&syntax->super_SynBase,(local_b38->super_ExprBase).type);
    pEVar9 = CreateVariableAccess(ctx,pSVar8,pVVar10,false);
    pEVar9 = CreateAssignment(ctx,pSVar8,pEVar9,(ExprBase *)local_b38);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pSVar14 = (SynBase *)CONCAT44(extraout_var_06,iVar5);
    pTVar1 = ctx->typeVoid;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pSVar13 = (SynBase *)CONCAT44(extraout_var_07,iVar5);
    pSVar13->_vptr_SynBase = (_func_int **)0x0;
    *(VariableData **)&pSVar13->typeID = pVVar10;
    pSVar13->begin = (Lexeme *)0x0;
    *(undefined1 *)&pSVar13->end = 0;
    pSVar14->typeID = 0x1e;
    pSVar14->begin = (Lexeme *)pSVar8;
    pSVar14->end = (Lexeme *)pTVar1;
    (pSVar14->pos).begin = (char *)0x0;
    *(bool *)&(pSVar14->pos).end = false;
    pSVar14->_vptr_SynBase = (_func_int **)&PTR__ExprBase_003e64e0;
    pSVar14->next = pSVar13;
    *(ExprBase **)&pSVar14->listed = pEVar9;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar9 = (ExprBase *)CONCAT44(extraout_var_08,iVar5);
    pEVar11 = CreateVariableAccess(ctx,pSVar8,pVVar10,false);
    pEVar9->typeID = 0x16;
    pEVar9->source = &syntax->super_SynBase;
    pEVar9->type = local_b20;
    pEVar9->next = (ExprBase *)0x0;
    pEVar9->listed = false;
    pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6518;
    pEVar9[1]._vptr_ExprBase = (_func_int **)pEVar11;
    pEVar11 = AnalyzeExpression(ctx,((syntax->arguments).head)->value);
    local_948[0] = CreateAssignment(ctx,&syntax->super_SynBase,pEVar9,pEVar11);
    local_938 = (TypeBase *)ctx->allocator;
    local_960._0_8_ = local_960 + 0x10;
    local_960._8_4_ = 2;
    local_960._12_4_ = 3;
    local_960._16_8_ = pSVar14;
    pSVar14 = (SynBase *)CreateVariableAccess(ctx,pSVar8,pVVar10,false);
    if (local_960._8_4_ == local_960._12_4_) {
      SmallArray<ExprBase_*,_3U>::grow((SmallArray<ExprBase_*,_3U> *)local_960,local_960._8_4_);
    }
    if ((ArgumentData *)local_960._0_8_ != (ArgumentData *)0x0) {
      uVar19 = (ulong)(uint)local_960._8_4_;
      local_960._8_4_ = local_960._8_4_ + 1;
      ((SynBase **)local_960._0_8_)[uVar19] = pSVar14;
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      local_b38 = (ExprSequence *)CONCAT44(extraout_var_09,iVar5);
      arr_00.count = local_960._8_4_;
      arr_00.data = (ExprBase **)local_960._0_8_;
      arr_00._12_4_ = 0;
      ExprSequence::ExprSequence(local_b38,ctx->allocator,&syntax->super_SynBase,pTVar6,arr_00);
      goto LAB_001f1cbb;
    }
  }
LAB_001f21ce:
  pcVar18 = "void SmallArray<ExprBase *, 3>::push_back(const T &) [T = ExprBase *, N = 3]";
LAB_001f2252:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar18);
}

Assistant:

ExprBase* AnalyzeNew(ExpressionContext &ctx, SynNew *syntax)
{
	TypeBase *type = AnalyzeType(ctx, syntax->type, false);

	// If there is no count and we have an array type that failed, take last extend as the size
	if(!type && !syntax->count && isType<SynArrayIndex>(syntax->type))
	{
		SynArrayIndex *arrayIndex = getType<SynArrayIndex>(syntax->type);

		if(arrayIndex->arguments.size() == 1 && !arrayIndex->arguments.head->name)
		{
			syntax->count = arrayIndex->arguments.head->value;
			syntax->type = arrayIndex->value;

			type = AnalyzeType(ctx, syntax->type, false);
		}
	}

	// If there are no arguments and we have a function type that failed, take the arguments list as constructor arguments
	if(!type && syntax->arguments.empty() && isType<SynTypeFunction>(syntax->type))
	{
		SynTypeFunction *functionType = getType<SynTypeFunction>(syntax->type);

		for(SynBase *curr = functionType->arguments.head; curr; curr = curr->next)
			syntax->arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(curr->begin, curr->end, NULL, curr));

		syntax->type = new (ctx.get<SynTypeReference>()) SynTypeReference(functionType->begin, functionType->end, functionType->returnType);

		type = AnalyzeType(ctx, syntax->type, false);
	}

	// Report the original error
	if(!type)
	{
		AnalyzeType(ctx, syntax->type);

		type = ctx.GetErrorType();
	}

	if(type->isGeneric)
		Stop(ctx, syntax->type, "ERROR: generic type is not allowed");

	if(type == ctx.typeVoid || type == ctx.typeAuto)
		Stop(ctx, syntax->type, "ERROR: can't allocate objects of type '%.*s'", FMT_ISTR(type->name));

	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(!typeClass->completed)
			Stop(ctx, syntax->type, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(type->name));
	}

	SynBase *syntaxInternal = ctx.MakeInternal(syntax);

	if(syntax->count)
	{
		if(!syntax->arguments.empty())
			Report(ctx, syntax->arguments.head, "ERROR: can't provide constructor arguments to array allocation");

		if(!syntax->constructor.empty())
			Report(ctx, syntax->constructor.head, "ERROR: can't provide custom construction code for array allocation");

		ExprBase *count = AnalyzeExpression(ctx, syntax->count);

		ExprBase *alloc = CreateArrayAllocation(ctx, syntax, type, count);

		if(HasDefaultConstructor(ctx, syntax, type))
		{
			VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

			ExprBase *initializer = CreateAssignment(ctx, syntax, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
			ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

			if(ExprBase *call = CreateDefaultConstructorCall(ctx, syntax, variable->type, CreateVariableAccess(ctx, syntaxInternal, variable, true)))
				return CreateSequence(ctx, syntax, definition, call, CreateVariableAccess(ctx, syntaxInternal, variable, true));
		}

		return alloc;
	}

	ExprBase *alloc = CreateObjectAllocation(ctx, syntax, type);

	// Call constructor
	TypeRef *allocType = getType<TypeRef>(alloc->type);

	TypeBase *parentType = allocType->subType;

	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	if(GetTypeConstructorFunctions(ctx, parentType, syntax->arguments.empty(), functions))
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		ExprBase *overloads = CreateConstructorAccess(ctx, syntax, functions, CreateVariableAccess(ctx, syntaxInternal, variable, false));

		if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, IntrusiveList<TypeHandle>(), syntax->arguments.head, syntax->arguments.empty()))
		{
			SmallArray<ExprBase*, 3> expressions(ctx.allocator);

			expressions.push_back(definition);
			expressions.push_back(call);
			expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

			alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
		}
	}
	else if(syntax->arguments.size() == 1 && !syntax->arguments.head->name)
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		ExprBase *copy = CreateAssignment(ctx, syntax, new (ctx.get<ExprDereference>()) ExprDereference(syntax, parentType, CreateVariableAccess(ctx, syntaxInternal, variable, false)), AnalyzeExpression(ctx, syntax->arguments.head->value));

		SmallArray<ExprBase*, 3> expressions(ctx.allocator);

		expressions.push_back(definition);
		expressions.push_back(copy);
		expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

		alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
	}
	else if(!syntax->arguments.empty())
	{
		Stop(ctx, syntax, "ERROR: function '%.*s::%.*s' that accepts %d arguments is undefined", FMT_ISTR(parentType->name), FMT_ISTR(parentType->name), syntax->arguments.size());
	}

	// Handle custom constructor
	if(!syntax->constructor.empty())
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		TypedFunctionInstanceRequest request(parentType, syntax);

		ExprBase *function = NULL;

		if(ExprBase **it = ctx.newConstructorFunctions.find(request))
			function = *it;

		if(!function)
		{
			// Create a member function with the constructor body
			InplaceStr name = GetTemporaryFunctionName(ctx);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name);

			function = CreateFunctionDefinition(ctx, syntax, false, false, parentType, false, ctx.typeVoid, false, nameIdentifier, IntrusiveList<SynIdentifier>(), IntrusiveList<SynFunctionArgument>(), syntax->constructor, NULL, NULL, IntrusiveList<MatchData>());

			ctx.newConstructorFunctions.insert(request, function);
		}

		ExprFunctionDefinition *functionDefinition = getType<ExprFunctionDefinition>(function);

		// Call this member function
		SmallArray<FunctionValue, 32> functions(ctx.allocator);
		functions.push_back(FunctionValue(syntax, functionDefinition->function, CreateVariableAccess(ctx, syntaxInternal, variable, false)));

		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, IntrusiveList<TypeHandle>(), arguments, false);

		SmallArray<ExprBase*, 3> expressions(ctx.allocator);

		expressions.push_back(definition);
		expressions.push_back(call);
		expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

		alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
	}

	return alloc;
}